

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O0

int s_mp_mul_digs(mp_int *a,mp_int *b,mp_int *c,int digs)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  int in_ECX;
  ulong uVar6;
  ulong uVar7;
  mp_int *in_RDX;
  int *in_RSI;
  int *in_RDI;
  mp_digit *tmpy;
  mp_digit *tmpt;
  mp_digit tmpx;
  mp_word r;
  mp_digit u;
  int iy;
  int ix;
  int pb;
  int pa;
  int res;
  mp_int t;
  int in_stack_00000fb4;
  mp_int *in_stack_00000fb8;
  mp_int *in_stack_00000fc0;
  mp_int *in_stack_00000fc8;
  mp_int *in_stack_ffffffffffffff58;
  mp_int *in_stack_ffffffffffffff60;
  int local_98;
  int local_94;
  ulong *local_90;
  ulong *local_88;
  ulong local_60;
  int local_54;
  int local_50;
  mp_int local_40;
  int local_24;
  mp_int *local_20;
  int *local_18;
  int *local_10;
  int local_4;
  
  if (in_ECX < 0x200) {
    if (*in_RDI < *in_RSI) {
      local_94 = *in_RDI;
    }
    else {
      local_94 = *in_RSI;
    }
    if (local_94 < 0x100) {
      iVar5 = fast_s_mp_mul_digs(in_stack_00000fc8,in_stack_00000fc0,in_stack_00000fb8,
                                 in_stack_00000fb4);
      return iVar5;
    }
  }
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_4 = mp_init_size(in_stack_ffffffffffffff58,0);
  if (local_4 == 0) {
    local_40.used = local_24;
    iVar5 = *local_10;
    for (local_50 = 0; local_50 < iVar5; local_50 = local_50 + 1) {
      local_60 = 0;
      if (*local_18 < local_24 - local_50) {
        local_98 = *local_18;
      }
      else {
        local_98 = local_24 - local_50;
      }
      uVar1 = *(ulong *)(*(long *)(local_10 + 4) + (long)local_50 * 8);
      local_90 = *(ulong **)(local_18 + 4);
      local_88 = local_40.dp + local_50;
      for (local_54 = 0; local_54 < local_98; local_54 = local_54 + 1) {
        uVar2 = *local_88;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = uVar1;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = *local_90;
        in_stack_ffffffffffffff60 = SUB168(auVar3 * auVar4,0);
        uVar6 = (long)&in_stack_ffffffffffffff60->used + uVar2;
        uVar7 = uVar6 + local_60;
        *local_88 = uVar7 & 0xfffffffffffffff;
        local_60 = (SUB168(auVar3 * auVar4,8) +
                    (ulong)CARRY8(uVar2,(ulong)in_stack_ffffffffffffff60) +
                   (ulong)CARRY8(uVar6,local_60)) * 0x10 | uVar7 >> 0x3c;
        local_90 = local_90 + 1;
        local_88 = local_88 + 1;
      }
      if (local_50 + local_54 < local_24) {
        *local_88 = local_60;
      }
    }
    mp_clamp(&local_40);
    mp_exch(&local_40,local_20);
    mp_clear(in_stack_ffffffffffffff60);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int s_mp_mul_digs (mp_int * a, mp_int * b, mp_int * c, int digs)
{
  mp_int  t;
  int     res, pa, pb, ix, iy;
  mp_digit u;
  mp_word r;
  mp_digit tmpx, *tmpt, *tmpy;

  /* can we use the fast multiplier? */
  if (((digs) < MP_WARRAY) &&
      MIN (a->used, b->used) < 
          (1 << ((CHAR_BIT * sizeof (mp_word)) - (2 * DIGIT_BIT)))) {
    return fast_s_mp_mul_digs (a, b, c, digs);
  }

  if ((res = mp_init_size (&t, digs)) != MP_OKAY) {
    return res;
  }
  t.used = digs;

  /* compute the digits of the product directly */
  pa = a->used;
  for (ix = 0; ix < pa; ix++) {
    /* set the carry to zero */
    u = 0;

    /* limit ourselves to making digs digits of output */
    pb = MIN (b->used, digs - ix);

    /* setup some aliases */
    /* copy of the digit from a used within the nested loop */
    tmpx = a->dp[ix];
    
    /* an alias for the destination shifted ix places */
    tmpt = t.dp + ix;
    
    /* an alias for the digits of b */
    tmpy = b->dp;

    /* compute the columns of the output and propagate the carry */
    for (iy = 0; iy < pb; iy++) {
      /* compute the column as a mp_word */
      r       = ((mp_word)*tmpt) +
                ((mp_word)tmpx) * ((mp_word)*tmpy++) +
                ((mp_word) u);

      /* the new column is the lower part of the result */
      *tmpt++ = (mp_digit) (r & ((mp_word) MP_MASK));

      /* get the carry word from the result */
      u       = (mp_digit) (r >> ((mp_word) DIGIT_BIT));
    }
    /* set carry if it is placed below digs */
    if (ix + iy < digs) {
      *tmpt = u;
    }
  }

  mp_clamp (&t);
  mp_exch (&t, c);

  mp_clear (&t);
  return MP_OKAY;
}